

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user.c
# Opt level: O1

int linux_evfilt_user_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  byte *pbVar1;
  ushort uVar2;
  intptr_t iVar3;
  void *pvVar4;
  short sVar5;
  unsigned_short uVar6;
  uint uVar7;
  int iVar8;
  ssize_t sVar9;
  int *piVar10;
  bool bVar11;
  uint64_t cur;
  undefined1 auStack_18 [8];
  
  sVar5 = (src->kev).filter;
  uVar6 = (src->kev).flags;
  uVar7 = (src->kev).fflags;
  iVar3 = (src->kev).data;
  pvVar4 = (src->kev).udata;
  dst->ident = (src->kev).ident;
  dst->filter = sVar5;
  dst->flags = uVar6;
  dst->fflags = uVar7;
  dst->data = iVar3;
  dst->udata = pvVar4;
  pbVar1 = (byte *)((long)&dst->fflags + 3);
  *pbVar1 = *pbVar1 & 0x3e;
  uVar2 = (src->kev).flags;
  if ((uVar2 & 0x20) != 0) {
    pbVar1 = (byte *)((long)&(src->kev).fflags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  if ((uVar2 & 0xb0) != 0) {
    sVar9 = read((src->field_10).kn_timerfd,auStack_18,8);
    if (sVar9 < 0) {
      piVar10 = __errno_location();
      bVar11 = *piVar10 == 0xb;
    }
    else {
      bVar11 = sVar9 == 8;
    }
    if (!bVar11) {
      return -1;
    }
  }
  iVar8 = 0;
  if (((src->kev).flags & 0x80) != 0) {
    pbVar1 = (byte *)((long)&(src->kev).fflags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    iVar8 = knote_disable(filt,src);
  }
  if (((src->kev).flags & 0x10) != 0) {
    iVar8 = knote_delete(filt,src);
  }
  return iVar8 >> 0x1f | 1;
}

Assistant:

int
linux_evfilt_user_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr UNUSED)
{
    memcpy(dst, &src->kev, sizeof(*dst));
    dst->fflags &= ~NOTE_FFCTRLMASK;     //FIXME: Not sure if needed
    dst->fflags &= ~NOTE_TRIGGER;
    if (src->kev.flags & EV_CLEAR)
        src->kev.fflags &= ~NOTE_TRIGGER;
    if (src->kev.flags & (EV_DISPATCH | EV_CLEAR | EV_ONESHOT)) {
        if (eventfd_lower(src->kn_eventfd) < 0)
            return (-1);
    }

    if (src->kev.flags & EV_DISPATCH)
        src->kev.fflags &= ~NOTE_TRIGGER;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}